

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cpu_zeropage_instructions.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_29f27f::CpuZeropageTest_slo_zero_sets_n_Test::TestBody
          (CpuZeropageTest_slo_zero_sets_n_Test *this)

{
  (this->super_CpuZeropageTest).super_CpuTest.registers.p = '\x03';
  (this->super_CpuZeropageTest).super_CpuTest.registers.a = 0xf0;
  (this->super_CpuZeropageTest).super_CpuTest.expected.a = 0xfa;
  (this->super_CpuZeropageTest).super_CpuTest.expected.p = 0x80;
  (this->super_CpuZeropageTest).super_CpuTest.field_0x114 = 0x55;
  CpuZeropageTest::run_readwrite_instruction(&this->super_CpuZeropageTest,'\a',0xaa);
  return;
}

Assistant:

TEST_F(CpuZeropageTest, slo_zero_sets_n) {
    registers.p = C_FLAG | Z_FLAG;
    registers.a = 0b11110000;
    expected.a = 0b11111010;
    expected.p = N_FLAG;
    memory_content = 0b01010101;
    run_readwrite_instruction(SLO_ZERO, 0b10101010);
}